

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_32_pd_di(void)

{
  uint address;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = OPER_AY_DI_32();
  uVar3 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  iVar1 = *(int *)((long)m68ki_cpu.dar + uVar3 + 0x20);
  address = iVar1 - 4;
  *(uint *)((long)m68ki_cpu.dar + uVar3 + 0x20) = address;
  m68ki_write_16_fc(iVar1 - 2,m68ki_cpu.s_flag | 1,uVar2 & 0xffff);
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,uVar2 >> 0x10);
  m68ki_cpu.n_flag = uVar2 >> 0x18;
  m68ki_cpu.not_z_flag = uVar2;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_pd_di(void)
{
	uint res = OPER_AY_DI_32();
	uint ea = EA_AX_PD_32();

	m68ki_write_16(ea+2, res & 0xFFFF );
	m68ki_write_16(ea, (res >> 16) & 0xFFFF );

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}